

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void scalar_inverse_ntt(scalar *s)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int j;
  ulong uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  
  uVar7 = 0x80;
  for (uVar5 = 2; uVar5 < 0x100; uVar5 = uVar5 * 2) {
    uVar7 = uVar7 >> 1;
    uVar8 = (ulong)uVar5;
    uVar10 = 0;
    for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
      uVar1 = kInverseNTTRoots[uVar6 + uVar7];
      for (uVar9 = uVar10; uVar9 < uVar8 + uVar10; uVar9 = uVar9 + 1) {
        uVar2 = s->c[uVar8 + uVar9];
        uVar3 = s->c[uVar9];
        uVar4 = reduce_once(uVar3 + uVar2);
        s->c[uVar9] = uVar4;
        uVar4 = reduce((((uint)uVar3 - (uint)uVar2) + 0xd01) * (uint)uVar1);
        s->c[uVar8 + uVar9] = uVar4;
      }
      uVar10 = uVar10 + uVar8 * 2;
    }
  }
  for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 1) {
    uVar4 = reduce((uint)s->c[lVar11] * 0xce7);
    s->c[lVar11] = uVar4;
  }
  return;
}

Assistant:

static void scalar_inverse_ntt(scalar *s) {
  int step = DEGREE / 2;
  // `int` is used here because using `size_t` throughout caused a ~5% slowdown
  // with Clang 14 on Aarch64.
  for (int offset = 2; offset < DEGREE; offset <<= 1) {
    step >>= 1;
    int k = 0;
    for (int i = 0; i < step; i++) {
      uint32_t step_root = kInverseNTTRoots[i + step];
      for (int j = k; j < k + offset; j++) {
        uint16_t odd = s->c[j + offset];
        uint16_t even = s->c[j];
        s->c[j] = reduce_once(odd + even);
        s->c[j + offset] = reduce(step_root * (even - odd + kPrime));
      }
      k += 2 * offset;
    }
  }
  for (int i = 0; i < DEGREE; i++) {
    s->c[i] = reduce(s->c[i] * kInverseDegree);
  }
}